

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeFontGlyph(ImFont *param_1,ImFontGlyph *glyph)

{
  Text("Codepoint: U+%04X",(ulong)(*(uint *)glyph >> 2));
  Separator();
  Text("Visible: %d",(ulong)(*(uint *)glyph >> 1 & 1));
  Text("AdvanceX: %.1f",(double)glyph->AdvanceX);
  Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)glyph->X0,(double)glyph->Y0,(double)glyph->X1,
       (double)glyph->Y1);
  Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)glyph->U0,(double)glyph->V0,(double)glyph->U1,
       (double)glyph->V1);
  return;
}

Assistant:

void ImGui::DebugNodeFontGlyph(ImFont*, const ImFontGlyph* glyph)
{
    Text("Codepoint: U+%04X", glyph->Codepoint);
    Separator();
    Text("Visible: %d", glyph->Visible);
    Text("AdvanceX: %.1f", glyph->AdvanceX);
    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
}